

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O2

void __thiscall
S2EdgeTessellator::AppendUnprojected
          (S2EdgeTessellator *this,R2Point *pa,S2Point *a,R2Point *pb_in,S2Point *b,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  S1ChordAngle SVar1;
  double dVar2;
  R2Point pb;
  S2Point mid;
  R2Point pmid;
  R2Point local_68;
  S2Point local_58;
  R2Point local_40;
  
  local_68 = S2::Projection::WrapDestination(this->proj_,pa,pb_in);
  SVar1 = EstimateMaxError(this,pa,a,&local_68,b);
  dVar2 = (this->scaled_tolerance_).length2_;
  if (SVar1.length2_ <= dVar2) {
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(vertices,b);
  }
  else {
    (*this->proj_->_vptr_Projection[6])(0x3fe0000000000000,this->proj_,pa,&local_68);
    local_40.c_[1] = dVar2;
    (*this->proj_->_vptr_Projection[3])(&local_58,this->proj_,&local_40);
    AppendUnprojected(this,pa,a,&local_40,&local_58,vertices);
    AppendUnprojected(this,&local_40,&local_58,&local_68,b,vertices);
  }
  return;
}

Assistant:

void S2EdgeTessellator::AppendUnprojected(
    const R2Point& pa, const S2Point& a,
    const R2Point& pb_in, const S2Point& b, vector<S2Point>* vertices) const {
  // See notes above regarding measuring the interpolation error.
  R2Point pb = proj_.WrapDestination(pa, pb_in);
  if (EstimateMaxError(pa, a, pb, b) <= scaled_tolerance_) {
    vertices->push_back(b);
  } else {
    R2Point pmid = proj_.Interpolate(0.5, pa, pb);
    S2Point mid = proj_.Unproject(pmid);
    AppendUnprojected(pa, a, pmid, mid, vertices);
    AppendUnprojected(pmid, mid, pb, b, vertices);
  }
}